

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O2

void __thiscall RK_Individual::calculate_fitness(RK_Individual *this,Graph *graph,bool theBest)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  Vertex *pVVar4;
  Graph *pGVar5;
  reference ppCVar6;
  Edge *pEVar7;
  double *pdVar8;
  double *pdVar9;
  ulong uVar10;
  Edge **ppEVar11;
  int iVar12;
  int i;
  size_type __n;
  ulong uVar13;
  double dVar14;
  vector<Chromosome_*,_std::allocator<Chromosome_*>_> chromosomes;
  Chromosome *chromosome;
  
  chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pGVar5 = graph;
  while (pVVar4 = pGVar5->verticesList, pVVar4 != (Vertex *)0x0) {
    ppEVar11 = &pVVar4->edgesList;
    while (pEVar7 = *ppEVar11, pEVar7 != (Edge *)0x0) {
      if ((pEVar7->modifiable == true) && (pEVar7->marked == true)) {
        chromosome = (Chromosome *)operator_new(0x18);
        *(undefined8 *)&chromosome->position = 0;
        chromosome->edge = pEVar7;
        chromosome->weight = 0.0;
        std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::push_back
                  (&chromosomes,&chromosome);
      }
      ppEVar11 = &pEVar7->nextEdge;
    }
    pGVar5 = (Graph *)&pVVar4->nextVertex;
  }
  pdVar8 = this->weights;
  uVar10 = 0;
  uVar13 = (ulong)(uint)this->number_of_edges;
  if (this->number_of_edges < 1) {
    uVar13 = uVar10;
  }
  for (; uVar13 != uVar10; uVar10 = uVar10 + 1) {
    chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
    super__Vector_impl_data._M_start[uVar10]->weight = pdVar8[uVar10];
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(Chromosome*,Chromosome*)>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
               super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(Chromosome_*,_Chromosome_*)>)0x104fd0);
  iVar1 = graph->verticesSize;
  uVar2 = graph->numberOfNonModifiable;
  pGVar5 = graph;
  while (pVVar4 = pGVar5->verticesList, pVVar4 != (Vertex *)0x0) {
    ppEVar11 = &pVVar4->edgesList;
    while (pEVar7 = *ppEVar11, pEVar7 != (Edge *)0x0) {
      pEVar7->closed = (bool)(pEVar7->modifiable ^ 1);
      pEVar7->activePowerFlow = 0.0;
      pEVar7->reactivePowerFlow = 0.0;
      pEVar7->activeLoss = 0.0;
      pEVar7->reactiveLoss = 0.0;
      ppEVar11 = &pEVar7->nextEdge;
    }
    pGVar5 = (Graph *)&pVVar4->nextVertex;
  }
  Graph::resetIDTree(graph);
  __n = 0;
  iVar12 = 0;
  while (iVar12 < (int)(iVar1 + ~uVar2)) {
    ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
    iVar3 = (*ppCVar6)->edge->origin->idTree;
    ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
    if ((iVar3 != (*ppCVar6)->edge->destiny->idTree) &&
       (ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n),
       (*ppCVar6)->edge->closed == false)) {
      ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
      iVar3 = (*ppCVar6)->edge->origin->idTree;
      pGVar5 = graph;
      while (pVVar4 = pGVar5->verticesList, pVVar4 != (Vertex *)0x0) {
        if (pVVar4->idTree == iVar3) {
          ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
          pVVar4->idTree = (*ppCVar6)->edge->destiny->idTree;
        }
        pGVar5 = (Graph *)&pVVar4->nextVertex;
      }
      ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
      (*ppCVar6)->edge->closed = true;
      ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
      iVar3 = (*ppCVar6)->edge->destiny->id;
      ppCVar6 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at(&chromosomes,__n);
      pEVar7 = Graph::findEdge(graph,iVar3,(*ppCVar6)->edge->origin->id);
      pEVar7->closed = true;
      iVar12 = iVar12 + 1;
    }
    __n = __n + 1;
  }
  Graph::defineFlows(graph);
  Graph::capacitor_allocation(graph);
  Graph::evaluateLossesAndFlows(graph,1e-08,0);
  pdVar8 = Graph::getLosses(graph);
  this->active_loss = *pdVar8;
  dVar14 = pdVar8[1];
  this->reactive_loss = dVar14;
  if (NAN(*pdVar8)) {
    this->active_loss = 9999999999.0;
    dVar14 = pdVar8[1];
  }
  if (NAN(dVar14)) {
    this->reactive_loss = 9999999999.0;
  }
  pdVar9 = Graph::getTotalLoss(graph);
  uVar13 = -(ulong)NAN(pdVar9[1]);
  this->objective_function = (double)(~uVar13 & (ulong)pdVar9[1] | uVar13 & 0x4202a05f1ff80000);
  operator_delete(pdVar8,8);
  if (!theBest) {
    while (pVVar4 = graph->verticesList, pVVar4 != (Vertex *)0x0) {
      Vertex::rm_all_capacitors(pVVar4);
      graph = (Graph *)&pVVar4->nextVertex;
    }
  }
  if (chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  std::_Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>::~_Vector_base
            (&chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>);
  return;
}

Assistant:

void RK_Individual::calculate_fitness(Graph *graph , bool theBest ){
    vector<Chromosome*> chromosomes;


    Chromosome *chromosome;
    for( Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext() ){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){
		if(e->getModifiable() == true && e->getMarked() == true){
            chromosome = new Chromosome();
            chromosome->edge = e;
            chromosome->weight = 0;
            chromosomes.push_back(chromosome);
	        }
	}

    }

    for(int i=0; i < this->number_of_edges; i++) /// Copia peso do individio paca cada cromossomo
        chromosomes[i]->weight = this->weights[i];

    sort(chromosomes.begin(), chromosomes.end(), sortChromosome);

    int inserted_size = 0, toInsert_size = graph->getVerticesSize()-1- graph->getNumberOfNonModifiable();


    for(Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext()){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e = e->getNext()){

            //arcos nao modificaveis ficam sempre fechados
            if(e->getModifiable() == false)
                e->setSwitch(true);
            else
                e->setSwitch(false);

            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }

    graph->resetIDTree();                               // reseta os ids de componentes conexas para algoritmo de Kruskal
    for(int i=0; inserted_size<toInsert_size; i++){     // percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal)
        if( (chromosomes.at(i)->edge->getOrigin()->getIdTree() != chromosomes.at(i)->edge->getDestiny()->getIdTree()) &&
                chromosomes.at(i)->edge->isClosed()==false){
            int id = chromosomes.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *v = graph->get_verticesList(); v!=NULL; v = v->getNext()){
                if(v->getIdTree()==id)
                    v->setIdTree(chromosomes.at(i)->edge->getDestiny()->getIdTree());
            }
            chromosomes.at(i)->edge->setSwitch(true);
            graph->findEdge(chromosomes.at(i)->edge->getDestiny()->getID(), chromosomes.at(i)->edge->getOrigin()->getID())->setSwitch(true);
            inserted_size++;
        }
    }

    graph->defineFlows();

    graph->capacitor_allocation();          // TODO: trocar calculo da funcao objetivo para o custo total (todos niveis) em dinheiro US$

    graph->evaluateLossesAndFlows(1e-8);    // calcula fluxos e perda com erro de 1e-5

    double *losses = graph->getLosses();    // soma as perdas ativas e reativas em todos os arcos e retorna um double

    this->active_loss           = losses[0];
    this->reactive_loss         = losses[1];

    // No caso de solucoes que possuem configuracao viavel porem sao muito longas
    if( isnan(losses[0]) )      this->active_loss   = 9999999999;
    if( isnan(losses[1]) )      this->reactive_loss = 9999999999;

    this->objective_function    = graph->getTotalLoss()[1];
    if(isnan( this->objective_function ) )    this->objective_function = 9999999999;

//    cout << "Perda Total:    " << graph->getTotalLoss()[0] << endl;
//    cout << "Custo Total:    " << graph->getTotalLoss()[1] << endl;

    delete losses;

    if( !theBest )
    for (Vertex *vertex_caps = graph->get_verticesList(); vertex_caps != NULL; vertex_caps = vertex_caps->getNext()) {
        vertex_caps->rm_all_capacitors();
    }

    chromosomes.clear();    // Deletar vetor de cromossomos(nao esta deletando memoria)
}